

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

ptls_key_schedule_t *
key_schedule_new(ptls_cipher_suite_t *preferred,ptls_cipher_suite_t **offered,
                char *hkdf_label_prefix)

{
  ptls_cipher_suite_t **pppVar1;
  ptls_hash_algorithm_t *ppVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  ptls_key_schedule_t *sched;
  ptls_hash_context_t *ppVar6;
  ptls_cipher_suite_t *ppVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  
  pcVar10 = "tls13 ";
  if (hkdf_label_prefix != (char *)0x0) {
    pcVar10 = hkdf_label_prefix;
  }
  uVar9 = (ulong)(preferred != (ptls_cipher_suite_t *)0x0);
  if ((offered != (ptls_cipher_suite_t **)0x0) &&
     (ppVar7 = *offered, ppVar7 != (ptls_cipher_suite_t *)0x0)) {
    lVar5 = 0;
    do {
      if ((preferred == (ptls_cipher_suite_t *)0x0) || (ppVar7->hash != preferred->hash)) {
        bVar11 = lVar5 == 0;
        if ((!bVar11) && (ppVar7->hash != (*offered)->hash)) {
          lVar8 = 1;
          do {
            bVar11 = lVar5 == lVar8;
            if (bVar11) break;
            pppVar1 = offered + lVar8;
            lVar8 = lVar8 + 1;
          } while (ppVar7->hash != (*pppVar1)->hash);
        }
        uVar9 = uVar9 + bVar11;
      }
      ppVar7 = offered[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (ppVar7 != (ptls_cipher_suite_t *)0x0);
  }
  sched = (ptls_key_schedule_t *)malloc(uVar9 * 0x10 + 0x58);
  if (sched == (ptls_key_schedule_t *)0x0) {
    return (ptls_key_schedule_t *)0x0;
  }
  *(undefined8 *)sched = 0;
  sched->hkdf_label_prefix = pcVar10;
  sched->secret[0] = '\0';
  sched->secret[1] = '\0';
  sched->secret[2] = '\0';
  sched->secret[3] = '\0';
  sched->secret[4] = '\0';
  sched->secret[5] = '\0';
  sched->secret[6] = '\0';
  sched->secret[7] = '\0';
  sched->secret[8] = '\0';
  sched->secret[9] = '\0';
  sched->secret[10] = '\0';
  sched->secret[0xb] = '\0';
  sched->secret[0xc] = '\0';
  sched->secret[0xd] = '\0';
  sched->secret[0xe] = '\0';
  sched->secret[0xf] = '\0';
  sched->secret[0x10] = '\0';
  sched->secret[0x11] = '\0';
  sched->secret[0x12] = '\0';
  sched->secret[0x13] = '\0';
  sched->secret[0x14] = '\0';
  sched->secret[0x15] = '\0';
  sched->secret[0x16] = '\0';
  sched->secret[0x17] = '\0';
  sched->secret[0x18] = '\0';
  sched->secret[0x19] = '\0';
  sched->secret[0x1a] = '\0';
  sched->secret[0x1b] = '\0';
  sched->secret[0x1c] = '\0';
  sched->secret[0x1d] = '\0';
  sched->secret[0x1e] = '\0';
  sched->secret[0x1f] = '\0';
  sched->secret[0x20] = '\0';
  sched->secret[0x21] = '\0';
  sched->secret[0x22] = '\0';
  sched->secret[0x23] = '\0';
  sched->secret[0x24] = '\0';
  sched->secret[0x25] = '\0';
  sched->secret[0x26] = '\0';
  sched->secret[0x27] = '\0';
  sched->secret[0x28] = '\0';
  sched->secret[0x29] = '\0';
  sched->secret[0x2a] = '\0';
  sched->secret[0x2b] = '\0';
  sched->secret[0x2c] = '\0';
  sched->secret[0x2d] = '\0';
  sched->secret[0x2e] = '\0';
  sched->secret[0x2f] = '\0';
  sched->secret[0x30] = '\0';
  sched->secret[0x31] = '\0';
  sched->secret[0x32] = '\0';
  sched->secret[0x33] = '\0';
  sched->secret[0x34] = '\0';
  sched->secret[0x35] = '\0';
  sched->secret[0x36] = '\0';
  sched->secret[0x37] = '\0';
  sched->secret[0x38] = '\0';
  sched->secret[0x39] = '\0';
  sched->secret[0x3a] = '\0';
  sched->secret[0x3b] = '\0';
  sched->secret[0x3c] = '\0';
  sched->secret[0x3d] = '\0';
  sched->secret[0x3e] = '\0';
  sched->secret[0x3f] = '\0';
  sched->num_hashes = 0;
  sched->hashes[0].algo = (ptls_hash_algorithm_t *)0x0;
  sched->hashes[0].ctx = (ptls_hash_context_t *)0x0;
  if (preferred != (ptls_cipher_suite_t *)0x0) {
    ppVar2 = preferred->hash;
    sched->hashes[sched->num_hashes].algo = ppVar2;
    ppVar6 = (*ppVar2->create)();
    sVar3 = sched->num_hashes;
    sched->hashes[sVar3].ctx = ppVar6;
    if (ppVar6 == (ptls_hash_context_t *)0x0) {
      iVar4 = 0xc;
      goto LAB_0011c3f6;
    }
    sched->num_hashes = sVar3 + 1;
  }
  if (offered != (ptls_cipher_suite_t **)0x0) {
    ppVar7 = *offered;
    bVar11 = ppVar7 == (ptls_cipher_suite_t *)0x0;
    if (!bVar11) {
      lVar5 = 0;
      do {
        if ((preferred == (ptls_cipher_suite_t *)0x0) || (ppVar7->hash != preferred->hash)) {
          bVar12 = lVar5 == 0;
          if (!bVar12) {
            if (ppVar7->hash != (*offered)->hash) {
              lVar8 = 1;
              do {
                bVar12 = lVar5 == lVar8;
                if (bVar12) goto LAB_0011c39a;
                pppVar1 = offered + lVar8;
                lVar8 = lVar8 + 1;
              } while (ppVar7->hash != (*pppVar1)->hash);
            }
            if (!bVar12) goto LAB_0011c3c9;
          }
LAB_0011c39a:
          ppVar2 = ppVar7->hash;
          sched->hashes[sched->num_hashes].algo = ppVar2;
          ppVar6 = (*ppVar2->create)();
          sVar3 = sched->num_hashes;
          sched->hashes[sVar3].ctx = ppVar6;
          if (ppVar6 == (ptls_hash_context_t *)0x0) {
            iVar4 = 0xc;
            goto LAB_0011c3ee;
          }
          sched->num_hashes = sVar3 + 1;
        }
LAB_0011c3c9:
        ppVar7 = offered[lVar5 + 1];
        lVar5 = lVar5 + 1;
        bVar11 = ppVar7 == (ptls_cipher_suite_t *)0x0;
      } while (!bVar11);
    }
    iVar4 = 0;
LAB_0011c3ee:
    if (!bVar11) goto LAB_0011c3f6;
  }
  iVar4 = 0;
LAB_0011c3f6:
  if (iVar4 == 0xc) {
    key_schedule_free(sched);
  }
  else if (iVar4 == 0) {
    return sched;
  }
  return (ptls_key_schedule_t *)0x0;
}

Assistant:

static ptls_key_schedule_t *key_schedule_new(ptls_cipher_suite_t *preferred, ptls_cipher_suite_t **offered,
                                             const char *hkdf_label_prefix)
{
#define FOREACH_HASH(block)                                                                                                        \
    do {                                                                                                                           \
        ptls_cipher_suite_t *cs;                                                                                                   \
        if ((cs = preferred) != NULL) {                                                                                            \
            block                                                                                                                  \
        }                                                                                                                          \
        if (offered != NULL) {                                                                                                     \
            size_t i, j;                                                                                                           \
            for (i = 0; (cs = offered[i]) != NULL; ++i) {                                                                          \
                if (preferred == NULL || cs->hash != preferred->hash) {                                                            \
                    for (j = 0; j != i; ++j)                                                                                       \
                        if (cs->hash == offered[j]->hash)                                                                          \
                            break;                                                                                                 \
                    if (j == i) {                                                                                                  \
                        block                                                                                                      \
                    }                                                                                                              \
                }                                                                                                                  \
            }                                                                                                                      \
        }                                                                                                                          \
    } while (0)

    ptls_key_schedule_t *sched;

    if (hkdf_label_prefix == NULL)
        hkdf_label_prefix = PTLS_HKDF_EXPAND_LABEL_PREFIX;

    { /* allocate */
        size_t num_hashes = 0;
        FOREACH_HASH({ ++num_hashes; });
        if ((sched = malloc(offsetof(ptls_key_schedule_t, hashes) + sizeof(sched->hashes[0]) * num_hashes)) == NULL)
            return NULL;
        *sched = (ptls_key_schedule_t){0, hkdf_label_prefix};
    }

    /* setup the hash algos and contexts */
    FOREACH_HASH({
        sched->hashes[sched->num_hashes].algo = cs->hash;
        if ((sched->hashes[sched->num_hashes].ctx = cs->hash->create()) == NULL)
            goto Fail;
        ++sched->num_hashes;
    });

    return sched;
Fail:
    key_schedule_free(sched);
    return NULL;

#undef FOREACH_HASH
}